

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O3

attr_list ContactWriter(SstStream Stream,char *Filename,SstParams Params,SMPI_Comm comm,
                       CMConnection *conn_p,void **WriterFileID_p)

{
  uint uVar1;
  CPNetworkInfoFunc p_Var2;
  int iVar3;
  char *pcVar4;
  attr_list p_Var5;
  size_t sVar6;
  char *pcVar7;
  FILE *__stream;
  ushort **ppuVar8;
  CMConnection p_Var9;
  long lVar10;
  long lVar11;
  stat Buf;
  uint local_2890;
  int local_288c;
  SstStream local_2888;
  CMConnection *local_2880;
  void **local_2878;
  char *local_2870;
  undefined7 local_2868;
  undefined1 uStack_2861;
  undefined7 uStack_2860;
  char local_2839;
  stat local_2838 [71];
  
  local_288c = 0;
  if (Stream->Rank != 0) {
    SMPI_Bcast(&local_288c,1,SMPI_INT,0,Stream->mpiComm);
    iVar3 = local_288c;
    if ((long)local_288c == 0) {
      return (attr_list)0x0;
    }
    pcVar4 = (char *)malloc((long)local_288c);
    SMPI_Bcast(pcVar4,iVar3,SMPI_CHAR,0,Stream->mpiComm);
    p_Var5 = (attr_list)attr_list_from_string(pcVar4);
    goto LAB_0072b14c;
  }
  if (Stream->RegistrationMethod == SstRegisterScreen) {
    local_2880 = conn_p;
    fprintf(_stdout,
            "Please enter the contact information associated with SST input stream \"%s\":\n",
            Filename);
    pcVar7 = fgets((char *)local_2838,0x2800,_stdin);
    if (pcVar7 == (char *)0x0) {
      fwrite("Read from stdin failed, exiting\n",0x20,1,_stdout);
      exit(1);
    }
    ppuVar8 = __ctype_b_loc();
    pcVar7 = &local_2839;
    do {
      pcVar4 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
    } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
    pcVar7 = strdup(pcVar7);
    Stream = Stream;
LAB_0072b039:
    if (pcVar7 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar7);
      pcVar4 = (char *)malloc(sVar6 + 1);
      __isoc99_sscanf(pcVar7,"%p:%s",WriterFileID_p);
      free(pcVar7);
      p_Var2 = globalNetinfoCallback;
      if (globalNetinfoCallback != (CPNetworkInfoFunc)0x0) {
        pcVar7 = CP_GetContactString(Stream,(attr_list)0x0);
        (*p_Var2)(1,pcVar7,IPDiagString);
        (*globalNetinfoCallback)(2,pcVar4,(char *)0x0);
      }
      p_Var5 = (attr_list)attr_list_from_string(pcVar4);
      p_Var9 = Tunneling_get_conn(Stream->CPInfo->SharedCM->cm,p_Var5);
      free_attr_list(p_Var5);
      if (p_Var9 != (CMConnection)0x0) {
        sVar6 = strlen(pcVar4);
        local_288c = (int)sVar6 + 1;
        conn_p = local_2880;
        goto LAB_0072b0fd;
      }
    }
    local_288c = 0;
    p_Var9 = (CMConnection)0x0;
    conn_p = local_2880;
  }
  else {
    if (Stream->RegistrationMethod == SstRegisterFile) {
      uVar1 = Params->OpenTimeoutSecs;
      local_2880 = conn_p;
      local_2878 = WriterFileID_p;
      sVar6 = strlen(Filename);
      pcVar7 = (char *)malloc(sVar6 + 5);
      lVar11 = (long)(int)uVar1 * 1000;
      local_2870 = Filename;
      snprintf(pcVar7,sVar6 + 5,"%s.sst",Filename);
      local_2888 = Stream;
      CP_verbose(Stream,PerRankVerbose,
                 "Looking for writer contact in file %s, with timeout %d secs\n",pcVar7,(ulong)uVar1
                );
      lVar10 = 5000;
      local_2890 = 0;
      while( true ) {
        __stream = fopen(pcVar7,"r");
        while (__stream == (FILE *)0x0) {
          usleep(100000);
          if (lVar10 == 100) {
            fprintf(_stderr,
                    "ADIOS2 SST Engine waiting for contact information file %s to be created\n",
                    local_2870);
          }
          if (lVar11 < 0x65) {
            free(pcVar7);
            pcVar7 = (char *)0x0;
            Stream = local_2888;
            WriterFileID_p = local_2878;
            goto LAB_0072b039;
          }
          __stream = fopen(pcVar7,"r");
          lVar10 = lVar10 + -100;
          lVar11 = lVar11 + -100;
        }
        iVar3 = fileno(__stream);
        fstat(iVar3,local_2838);
        WriterFileID_p = local_2878;
        if (((uint)local_2838[0].st_size != 0) || (3 < local_2890)) break;
        local_2890 = local_2890 + 1;
        usleep(100000);
      }
      if ((uint)local_2838[0].st_size < 0xf) {
LAB_0072b21f:
        ContactWriter_cold_3();
      }
      else {
        sVar6 = fread(&local_2868,0xf,1,__stream);
        if (sVar6 != 1) {
          ContactWriter_cold_1();
          goto LAB_0072b21f;
        }
        if (CONCAT71(uStack_2860,uStack_2861) != 0xa3076205453532d ||
            CONCAT17(uStack_2861,local_2868) != 0x2d32534f49444123) goto LAB_0072b21f;
        free(pcVar7);
        pcVar7 = (char *)calloc(1,(local_2838[0].st_size << 0x20) + -0xe00000000 >> 0x20);
        sVar6 = fread(pcVar7,(local_2838[0].st_size << 0x20) + -0xf00000000 >> 0x20,1,__stream);
        if (sVar6 == 1) {
          fclose(__stream);
          Stream = local_2888;
          goto LAB_0072b039;
        }
        ContactWriter_cold_2();
      }
      pcVar7 = (char *)0x0;
      Stream = local_2888;
      goto LAB_0072b039;
    }
    pcVar4 = (char *)0x0;
    local_288c = 0;
    p_Var9 = (CMConnection)0x0;
  }
LAB_0072b0fd:
  *conn_p = p_Var9;
  p_Var5 = (attr_list)0x0;
  SMPI_Bcast(&local_288c,1,SMPI_INT,0,Stream->mpiComm);
  if (local_288c != 0) {
    SMPI_Bcast(pcVar4,local_288c,SMPI_CHAR,0,Stream->mpiComm);
    p_Var5 = (attr_list)attr_list_from_string(pcVar4);
  }
  if (pcVar4 == (char *)0x0) {
    return p_Var5;
  }
LAB_0072b14c:
  free(pcVar4);
  return p_Var5;
}

Assistant:

attr_list ContactWriter(SstStream Stream, char *Filename, SstParams Params, SMPI_Comm comm,
                        CMConnection *conn_p, void **WriterFileID_p)
{
    int DataSize = 0;
    attr_list RetVal = NULL;

    if (Stream->Rank == 0)
    {
        char *Writer0Contact = readContactInfo(Filename, Stream, Params->OpenTimeoutSecs);
        char *CMContactString = NULL;
        CMConnection conn = NULL;
        attr_list WriterRank0Contact;

        if (Writer0Contact)
        {

            CMContactString = malloc(strlen(Writer0Contact) + 1); /* +1 for null terminator */
            sscanf(Writer0Contact, "%p:%s", WriterFileID_p, CMContactString);
            //        printf("Writer contact info is fileID %p, contact info
            //        %s\n",
            //               WriterFileID, CMContactString);
            free(Writer0Contact);

            if (globalNetinfoCallback)
            {
                (globalNetinfoCallback)(1, CP_GetContactString(Stream, NULL), IPDiagString);
                (globalNetinfoCallback)(2, CMContactString, NULL);
            }
            WriterRank0Contact = attr_list_from_string(CMContactString);
            conn = Tunneling_get_conn(Stream->CPInfo->SharedCM->cm, WriterRank0Contact);
            free_attr_list(WriterRank0Contact);
        }
        if (conn)
        {
            DataSize = (int)strlen(CMContactString) + 1;
            *conn_p = conn;
        }
        else
        {
            DataSize = 0;
            *conn_p = NULL;
        }
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        if (DataSize != 0)
        {
            SMPI_Bcast(CMContactString, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
            RetVal = attr_list_from_string(CMContactString);
        }
        if (CMContactString)
            free(CMContactString);
    }
    else
    {
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        if (DataSize != 0)
        {
            char *Buffer = malloc(DataSize);
            SMPI_Bcast(Buffer, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
            RetVal = attr_list_from_string(Buffer);
            free(Buffer);
        }
    }
    return RetVal;
}